

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

void btSoftBody::clusterDCImpulse(Cluster *cluster,btVector3 *impulse)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  
  fVar1 = cluster->m_imass;
  fVar2 = impulse->m_floats[2];
  uVar3 = *(undefined8 *)cluster->m_dimpulses[0].m_floats;
  *(ulong *)cluster->m_dimpulses[0].m_floats =
       CONCAT44((float)((ulong)uVar3 >> 0x20) +
                fVar1 * (float)((ulong)*(undefined8 *)impulse->m_floats >> 0x20),
                (float)uVar3 + fVar1 * (float)*(undefined8 *)impulse->m_floats);
  cluster->m_dimpulses[0].m_floats[2] = fVar2 * fVar1 + cluster->m_dimpulses[0].m_floats[2];
  cluster->m_ndimpulses = cluster->m_ndimpulses + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator*(const btVector3& v, const btScalar& s)
{
#if defined(BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
	__m128	vs = _mm_load_ss(&s);	//	(S 0 0 0)
	vs = bt_pshufd_ps(vs, 0x80);	//	(S S S 0.0)
	return btVector3(_mm_mul_ps(v.mVec128, vs));
#elif defined(BT_USE_NEON)
	float32x4_t r = vmulq_n_f32(v.mVec128, s);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(v.m_floats[0] * s, v.m_floats[1] * s, v.m_floats[2] * s);
#endif
}